

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O2

void sha1_step(sha1_ctxt *ctxt)

{
  anon_union_64_2_c9586734_for_m *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  ushort uVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  uint uVar64;
  ulong uVar65;
  long lVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  int iVar74;
  uint uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  paVar1 = &ctxt->m;
  auVar76 = *(undefined1 (*) [16])&ctxt->m;
  auVar78[1] = 0;
  auVar78[0] = auVar76[8];
  auVar78[2] = auVar76[9];
  auVar78[3] = 0;
  auVar78[4] = auVar76[10];
  auVar78[5] = 0;
  auVar78[6] = auVar76[0xb];
  auVar78[7] = 0;
  auVar78[8] = auVar76[0xc];
  auVar78[9] = 0;
  auVar78[10] = auVar76[0xd];
  auVar78[0xb] = 0;
  auVar78[0xc] = auVar76[0xe];
  auVar78[0xd] = 0;
  auVar78[0xe] = auVar76[0xf];
  auVar78[0xf] = 0;
  auVar79 = pshuflw(auVar78,auVar78,0x1b);
  auVar79 = pshufhw(auVar79,auVar79,0x1b);
  auVar24[0xd] = 0;
  auVar24._0_13_ = auVar76._0_13_;
  auVar24[0xe] = auVar76[7];
  auVar28[0xc] = auVar76[6];
  auVar28._0_12_ = auVar76._0_12_;
  auVar28._13_2_ = auVar24._13_2_;
  auVar32[0xb] = 0;
  auVar32._0_11_ = auVar76._0_11_;
  auVar32._12_3_ = auVar28._12_3_;
  auVar36[10] = auVar76[5];
  auVar36._0_10_ = auVar76._0_10_;
  auVar36._11_4_ = auVar32._11_4_;
  auVar40[9] = 0;
  auVar40._0_9_ = auVar76._0_9_;
  auVar40._10_5_ = auVar36._10_5_;
  auVar44[8] = auVar76[4];
  auVar44._0_8_ = auVar76._0_8_;
  auVar44._9_6_ = auVar40._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar44._8_7_;
  auVar56._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar56[0] = auVar76[3];
  auVar56._9_6_ = 0;
  auVar57._1_10_ = SUB1510(auVar56 << 0x30,5);
  auVar57[0] = auVar76[2];
  auVar57._11_4_ = 0;
  auVar48[2] = auVar76[1];
  auVar48._0_2_ = auVar76._0_2_;
  auVar48._3_12_ = SUB1512(auVar57 << 0x20,3);
  auVar76._0_2_ = auVar76._0_2_ & 0xff;
  auVar76._2_13_ = auVar48._2_13_;
  auVar76[0xf] = 0;
  auVar76 = pshuflw(auVar76,auVar76,0x1b);
  auVar76 = pshufhw(auVar76,auVar76,0x1b);
  sVar7 = auVar76._0_2_;
  sVar8 = auVar76._2_2_;
  sVar9 = auVar76._4_2_;
  sVar10 = auVar76._6_2_;
  sVar11 = auVar76._8_2_;
  sVar12 = auVar76._10_2_;
  sVar13 = auVar76._12_2_;
  sVar14 = auVar76._14_2_;
  sVar15 = auVar79._0_2_;
  sVar16 = auVar79._2_2_;
  sVar17 = auVar79._4_2_;
  sVar18 = auVar79._6_2_;
  sVar19 = auVar79._8_2_;
  sVar20 = auVar79._10_2_;
  sVar21 = auVar79._12_2_;
  sVar22 = auVar79._14_2_;
  (ctxt->m).b8[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar76[0] - (0xff < sVar7);
  (ctxt->m).b8[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar76[2] - (0xff < sVar8);
  (ctxt->m).b8[2] = (0 < sVar9) * (sVar9 < 0x100) * auVar76[4] - (0xff < sVar9);
  (ctxt->m).b8[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar76[6] - (0xff < sVar10);
  (ctxt->m).b8[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
  (ctxt->m).b8[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar76[10] - (0xff < sVar12);
  (ctxt->m).b8[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar76[0xc] - (0xff < sVar13);
  (ctxt->m).b8[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[0xe] - (0xff < sVar14);
  (ctxt->m).b8[8] = (0 < sVar15) * (sVar15 < 0x100) * auVar79[0] - (0xff < sVar15);
  (ctxt->m).b8[9] = (0 < sVar16) * (sVar16 < 0x100) * auVar79[2] - (0xff < sVar16);
  (ctxt->m).b8[10] = (0 < sVar17) * (sVar17 < 0x100) * auVar79[4] - (0xff < sVar17);
  (ctxt->m).b8[0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar79[6] - (0xff < sVar18);
  (ctxt->m).b8[0xc] = (0 < sVar19) * (sVar19 < 0x100) * auVar79[8] - (0xff < sVar19);
  (ctxt->m).b8[0xd] = (0 < sVar20) * (sVar20 < 0x100) * auVar79[10] - (0xff < sVar20);
  (ctxt->m).b8[0xe] = (0 < sVar21) * (sVar21 < 0x100) * auVar79[0xc] - (0xff < sVar21);
  (ctxt->m).b8[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar79[0xe] - (0xff < sVar22);
  auVar76 = *(undefined1 (*) [16])((long)&ctxt->m + 0x10);
  auVar80[1] = 0;
  auVar80[0] = auVar76[8];
  auVar80[2] = auVar76[9];
  auVar80[3] = 0;
  auVar80[4] = auVar76[10];
  auVar80[5] = 0;
  auVar80[6] = auVar76[0xb];
  auVar80[7] = 0;
  auVar80[8] = auVar76[0xc];
  auVar80[9] = 0;
  auVar80[10] = auVar76[0xd];
  auVar80[0xb] = 0;
  auVar80[0xc] = auVar76[0xe];
  auVar80[0xd] = 0;
  auVar80[0xe] = auVar76[0xf];
  auVar80[0xf] = 0;
  auVar79 = pshuflw(auVar80,auVar80,0x1b);
  auVar81 = pshufhw(auVar79,auVar79,0x1b);
  auVar25[0xd] = 0;
  auVar25._0_13_ = auVar76._0_13_;
  auVar25[0xe] = auVar76[7];
  auVar29[0xc] = auVar76[6];
  auVar29._0_12_ = auVar76._0_12_;
  auVar29._13_2_ = auVar25._13_2_;
  auVar33[0xb] = 0;
  auVar33._0_11_ = auVar76._0_11_;
  auVar33._12_3_ = auVar29._12_3_;
  auVar37[10] = auVar76[5];
  auVar37._0_10_ = auVar76._0_10_;
  auVar37._11_4_ = auVar33._11_4_;
  auVar41[9] = 0;
  auVar41._0_9_ = auVar76._0_9_;
  auVar41._10_5_ = auVar37._10_5_;
  auVar45[8] = auVar76[4];
  auVar45._0_8_ = auVar76._0_8_;
  auVar45._9_6_ = auVar41._9_6_;
  auVar53._7_8_ = 0;
  auVar53._0_7_ = auVar45._8_7_;
  auVar58._1_8_ = SUB158(auVar53 << 0x40,7);
  auVar58[0] = auVar76[3];
  auVar58._9_6_ = 0;
  auVar59._1_10_ = SUB1510(auVar58 << 0x30,5);
  auVar59[0] = auVar76[2];
  auVar59._11_4_ = 0;
  auVar49[2] = auVar76[1];
  auVar49._0_2_ = auVar76._0_2_;
  auVar49._3_12_ = SUB1512(auVar59 << 0x20,3);
  auVar79._0_2_ = auVar76._0_2_ & 0xff;
  auVar79._2_13_ = auVar49._2_13_;
  auVar79[0xf] = 0;
  auVar76 = pshuflw(auVar79,auVar79,0x1b);
  auVar76 = pshufhw(auVar76,auVar76,0x1b);
  sVar7 = auVar76._0_2_;
  sVar8 = auVar76._2_2_;
  sVar9 = auVar76._4_2_;
  sVar10 = auVar76._6_2_;
  sVar11 = auVar76._8_2_;
  sVar12 = auVar76._10_2_;
  sVar13 = auVar76._12_2_;
  sVar14 = auVar76._14_2_;
  sVar15 = auVar81._0_2_;
  sVar16 = auVar81._2_2_;
  sVar17 = auVar81._4_2_;
  sVar18 = auVar81._6_2_;
  sVar19 = auVar81._8_2_;
  sVar20 = auVar81._10_2_;
  sVar21 = auVar81._12_2_;
  sVar22 = auVar81._14_2_;
  (ctxt->m).b8[0x10] = (0 < sVar7) * (sVar7 < 0x100) * auVar76[0] - (0xff < sVar7);
  (ctxt->m).b8[0x11] = (0 < sVar8) * (sVar8 < 0x100) * auVar76[2] - (0xff < sVar8);
  (ctxt->m).b8[0x12] = (0 < sVar9) * (sVar9 < 0x100) * auVar76[4] - (0xff < sVar9);
  (ctxt->m).b8[0x13] = (0 < sVar10) * (sVar10 < 0x100) * auVar76[6] - (0xff < sVar10);
  (ctxt->m).b8[0x14] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
  (ctxt->m).b8[0x15] = (0 < sVar12) * (sVar12 < 0x100) * auVar76[10] - (0xff < sVar12);
  (ctxt->m).b8[0x16] = (0 < sVar13) * (sVar13 < 0x100) * auVar76[0xc] - (0xff < sVar13);
  (ctxt->m).b8[0x17] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[0xe] - (0xff < sVar14);
  (ctxt->m).b8[0x18] = (0 < sVar15) * (sVar15 < 0x100) * auVar81[0] - (0xff < sVar15);
  (ctxt->m).b8[0x19] = (0 < sVar16) * (sVar16 < 0x100) * auVar81[2] - (0xff < sVar16);
  (ctxt->m).b8[0x1a] = (0 < sVar17) * (sVar17 < 0x100) * auVar81[4] - (0xff < sVar17);
  (ctxt->m).b8[0x1b] = (0 < sVar18) * (sVar18 < 0x100) * auVar81[6] - (0xff < sVar18);
  (ctxt->m).b8[0x1c] = (0 < sVar19) * (sVar19 < 0x100) * auVar81[8] - (0xff < sVar19);
  (ctxt->m).b8[0x1d] = (0 < sVar20) * (sVar20 < 0x100) * auVar81[10] - (0xff < sVar20);
  (ctxt->m).b8[0x1e] = (0 < sVar21) * (sVar21 < 0x100) * auVar81[0xc] - (0xff < sVar21);
  (ctxt->m).b8[0x1f] = (0 < sVar22) * (sVar22 < 0x100) * auVar81[0xe] - (0xff < sVar22);
  auVar76 = *(undefined1 (*) [16])((long)&ctxt->m + 0x20);
  auVar82[1] = 0;
  auVar82[0] = auVar76[8];
  auVar82[2] = auVar76[9];
  auVar82[3] = 0;
  auVar82[4] = auVar76[10];
  auVar82[5] = 0;
  auVar82[6] = auVar76[0xb];
  auVar82[7] = 0;
  auVar82[8] = auVar76[0xc];
  auVar82[9] = 0;
  auVar82[10] = auVar76[0xd];
  auVar82[0xb] = 0;
  auVar82[0xc] = auVar76[0xe];
  auVar82[0xd] = 0;
  auVar82[0xe] = auVar76[0xf];
  auVar82[0xf] = 0;
  auVar79 = pshuflw(auVar82,auVar82,0x1b);
  auVar79 = pshufhw(auVar79,auVar79,0x1b);
  auVar26[0xd] = 0;
  auVar26._0_13_ = auVar76._0_13_;
  auVar26[0xe] = auVar76[7];
  auVar30[0xc] = auVar76[6];
  auVar30._0_12_ = auVar76._0_12_;
  auVar30._13_2_ = auVar26._13_2_;
  auVar34[0xb] = 0;
  auVar34._0_11_ = auVar76._0_11_;
  auVar34._12_3_ = auVar30._12_3_;
  auVar38[10] = auVar76[5];
  auVar38._0_10_ = auVar76._0_10_;
  auVar38._11_4_ = auVar34._11_4_;
  auVar42[9] = 0;
  auVar42._0_9_ = auVar76._0_9_;
  auVar42._10_5_ = auVar38._10_5_;
  auVar46[8] = auVar76[4];
  auVar46._0_8_ = auVar76._0_8_;
  auVar46._9_6_ = auVar42._9_6_;
  auVar54._7_8_ = 0;
  auVar54._0_7_ = auVar46._8_7_;
  auVar60._1_8_ = SUB158(auVar54 << 0x40,7);
  auVar60[0] = auVar76[3];
  auVar60._9_6_ = 0;
  auVar61._1_10_ = SUB1510(auVar60 << 0x30,5);
  auVar61[0] = auVar76[2];
  auVar61._11_4_ = 0;
  auVar50[2] = auVar76[1];
  auVar50._0_2_ = auVar76._0_2_;
  auVar50._3_12_ = SUB1512(auVar61 << 0x20,3);
  auVar81._0_2_ = auVar76._0_2_ & 0xff;
  auVar81._2_13_ = auVar50._2_13_;
  auVar81[0xf] = 0;
  auVar76 = pshuflw(auVar81,auVar81,0x1b);
  auVar76 = pshufhw(auVar76,auVar76,0x1b);
  sVar7 = auVar76._0_2_;
  sVar8 = auVar76._2_2_;
  sVar9 = auVar76._4_2_;
  sVar10 = auVar76._6_2_;
  sVar11 = auVar76._8_2_;
  sVar12 = auVar76._10_2_;
  sVar13 = auVar76._12_2_;
  sVar14 = auVar76._14_2_;
  sVar15 = auVar79._0_2_;
  sVar16 = auVar79._2_2_;
  sVar17 = auVar79._4_2_;
  sVar18 = auVar79._6_2_;
  sVar19 = auVar79._8_2_;
  sVar20 = auVar79._10_2_;
  sVar21 = auVar79._12_2_;
  sVar22 = auVar79._14_2_;
  (ctxt->m).b8[0x20] = (0 < sVar7) * (sVar7 < 0x100) * auVar76[0] - (0xff < sVar7);
  (ctxt->m).b8[0x21] = (0 < sVar8) * (sVar8 < 0x100) * auVar76[2] - (0xff < sVar8);
  (ctxt->m).b8[0x22] = (0 < sVar9) * (sVar9 < 0x100) * auVar76[4] - (0xff < sVar9);
  (ctxt->m).b8[0x23] = (0 < sVar10) * (sVar10 < 0x100) * auVar76[6] - (0xff < sVar10);
  (ctxt->m).b8[0x24] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
  (ctxt->m).b8[0x25] = (0 < sVar12) * (sVar12 < 0x100) * auVar76[10] - (0xff < sVar12);
  (ctxt->m).b8[0x26] = (0 < sVar13) * (sVar13 < 0x100) * auVar76[0xc] - (0xff < sVar13);
  (ctxt->m).b8[0x27] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[0xe] - (0xff < sVar14);
  (ctxt->m).b8[0x28] = (0 < sVar15) * (sVar15 < 0x100) * auVar79[0] - (0xff < sVar15);
  (ctxt->m).b8[0x29] = (0 < sVar16) * (sVar16 < 0x100) * auVar79[2] - (0xff < sVar16);
  (ctxt->m).b8[0x2a] = (0 < sVar17) * (sVar17 < 0x100) * auVar79[4] - (0xff < sVar17);
  (ctxt->m).b8[0x2b] = (0 < sVar18) * (sVar18 < 0x100) * auVar79[6] - (0xff < sVar18);
  (ctxt->m).b8[0x2c] = (0 < sVar19) * (sVar19 < 0x100) * auVar79[8] - (0xff < sVar19);
  (ctxt->m).b8[0x2d] = (0 < sVar20) * (sVar20 < 0x100) * auVar79[10] - (0xff < sVar20);
  (ctxt->m).b8[0x2e] = (0 < sVar21) * (sVar21 < 0x100) * auVar79[0xc] - (0xff < sVar21);
  (ctxt->m).b8[0x2f] = (0 < sVar22) * (sVar22 < 0x100) * auVar79[0xe] - (0xff < sVar22);
  auVar76 = *(undefined1 (*) [16])((long)&ctxt->m + 0x30);
  auVar83[1] = 0;
  auVar83[0] = auVar76[8];
  auVar83[2] = auVar76[9];
  auVar83[3] = 0;
  auVar83[4] = auVar76[10];
  auVar83[5] = 0;
  auVar83[6] = auVar76[0xb];
  auVar83[7] = 0;
  auVar83[8] = auVar76[0xc];
  auVar83[9] = 0;
  auVar83[10] = auVar76[0xd];
  auVar83[0xb] = 0;
  auVar83[0xc] = auVar76[0xe];
  auVar83[0xd] = 0;
  auVar83[0xe] = auVar76[0xf];
  auVar83[0xf] = 0;
  auVar79 = pshuflw(auVar83,auVar83,0x1b);
  auVar79 = pshufhw(auVar79,auVar79,0x1b);
  auVar27[0xd] = 0;
  auVar27._0_13_ = auVar76._0_13_;
  auVar27[0xe] = auVar76[7];
  auVar31[0xc] = auVar76[6];
  auVar31._0_12_ = auVar76._0_12_;
  auVar31._13_2_ = auVar27._13_2_;
  auVar35[0xb] = 0;
  auVar35._0_11_ = auVar76._0_11_;
  auVar35._12_3_ = auVar31._12_3_;
  auVar39[10] = auVar76[5];
  auVar39._0_10_ = auVar76._0_10_;
  auVar39._11_4_ = auVar35._11_4_;
  auVar43[9] = 0;
  auVar43._0_9_ = auVar76._0_9_;
  auVar43._10_5_ = auVar39._10_5_;
  auVar47[8] = auVar76[4];
  auVar47._0_8_ = auVar76._0_8_;
  auVar47._9_6_ = auVar43._9_6_;
  auVar55._7_8_ = 0;
  auVar55._0_7_ = auVar47._8_7_;
  auVar62._1_8_ = SUB158(auVar55 << 0x40,7);
  auVar62[0] = auVar76[3];
  auVar62._9_6_ = 0;
  auVar63._1_10_ = SUB1510(auVar62 << 0x30,5);
  auVar63[0] = auVar76[2];
  auVar63._11_4_ = 0;
  auVar51[2] = auVar76[1];
  auVar51._0_2_ = auVar76._0_2_;
  auVar51._3_12_ = SUB1512(auVar63 << 0x20,3);
  auVar77._0_2_ = auVar76._0_2_ & 0xff;
  auVar77._2_13_ = auVar51._2_13_;
  auVar77[0xf] = 0;
  auVar76 = pshuflw((undefined1  [16])0x0,auVar77,0x1b);
  auVar76 = pshufhw(auVar76,auVar76,0x1b);
  sVar7 = auVar76._0_2_;
  sVar8 = auVar76._2_2_;
  sVar9 = auVar76._4_2_;
  sVar10 = auVar76._6_2_;
  sVar11 = auVar76._8_2_;
  sVar12 = auVar76._10_2_;
  sVar13 = auVar76._12_2_;
  sVar14 = auVar76._14_2_;
  sVar15 = auVar79._0_2_;
  sVar16 = auVar79._2_2_;
  sVar17 = auVar79._4_2_;
  sVar18 = auVar79._6_2_;
  sVar19 = auVar79._8_2_;
  sVar20 = auVar79._10_2_;
  sVar21 = auVar79._12_2_;
  sVar22 = auVar79._14_2_;
  (ctxt->m).b8[0x30] = (0 < sVar7) * (sVar7 < 0x100) * auVar76[0] - (0xff < sVar7);
  (ctxt->m).b8[0x31] = (0 < sVar8) * (sVar8 < 0x100) * auVar76[2] - (0xff < sVar8);
  (ctxt->m).b8[0x32] = (0 < sVar9) * (sVar9 < 0x100) * auVar76[4] - (0xff < sVar9);
  (ctxt->m).b8[0x33] = (0 < sVar10) * (sVar10 < 0x100) * auVar76[6] - (0xff < sVar10);
  (ctxt->m).b8[0x34] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[8] - (0xff < sVar11);
  (ctxt->m).b8[0x35] = (0 < sVar12) * (sVar12 < 0x100) * auVar76[10] - (0xff < sVar12);
  (ctxt->m).b8[0x36] = (0 < sVar13) * (sVar13 < 0x100) * auVar76[0xc] - (0xff < sVar13);
  (ctxt->m).b8[0x37] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[0xe] - (0xff < sVar14);
  (ctxt->m).b8[0x38] = (0 < sVar15) * (sVar15 < 0x100) * auVar79[0] - (0xff < sVar15);
  (ctxt->m).b8[0x39] = (0 < sVar16) * (sVar16 < 0x100) * auVar79[2] - (0xff < sVar16);
  (ctxt->m).b8[0x3a] = (0 < sVar17) * (sVar17 < 0x100) * auVar79[4] - (0xff < sVar17);
  (ctxt->m).b8[0x3b] = (0 < sVar18) * (sVar18 < 0x100) * auVar79[6] - (0xff < sVar18);
  (ctxt->m).b8[0x3c] = (0 < sVar19) * (sVar19 < 0x100) * auVar79[8] - (0xff < sVar19);
  (ctxt->m).b8[0x3d] = (0 < sVar20) * (sVar20 < 0x100) * auVar79[10] - (0xff < sVar20);
  (ctxt->m).b8[0x3e] = (0 < sVar21) * (sVar21 < 0x100) * auVar79[0xc] - (0xff < sVar21);
  (ctxt->m).b8[0x3f] = (0 < sVar22) * (sVar22 < 0x100) * auVar79[0xe] - (0xff < sVar22);
  uVar2 = (ctxt->h).b32[0];
  uVar3 = (ctxt->h).b32[1];
  uVar4 = (ctxt->h).b32[2];
  uVar5 = (ctxt->h).b32[3];
  uVar6 = (ctxt->h).b32[4];
  uVar70 = uVar3;
  uVar67 = uVar4;
  uVar69 = uVar5;
  uVar73 = uVar6;
  uVar75 = uVar2;
  for (uVar65 = 0; uVar64 = uVar69, uVar69 = uVar67, uVar65 != 0x14; uVar65 = uVar65 + 1) {
    uVar67 = (uint)uVar65;
    uVar71 = uVar67 & 0xf;
    if (uVar65 < 0x10) {
      uVar68 = paVar1->b32[uVar71];
    }
    else {
      uVar67 = paVar1->b32[uVar71 ^ 8] ^ paVar1->b32[uVar67 + 0xd & 0xf] ^
               paVar1->b32[uVar67 + 2 & 0xf] ^ paVar1->b32[uVar71];
      uVar68 = uVar67 << 1 | (uint)((int)uVar67 < 0);
      paVar1->b32[uVar71] = uVar68;
    }
    uVar71 = (uVar69 ^ uVar64) & uVar70;
    iVar74 = uVar73 + (uVar75 << 5 | uVar75 >> 0x1b);
    uVar67 = uVar70 << 0x1e;
    uVar73 = uVar70 >> 2;
    uVar70 = uVar75;
    uVar67 = uVar67 | uVar73;
    uVar73 = uVar64;
    uVar75 = uVar68 + iVar74 + (uVar71 ^ uVar64) + 0x5a827999;
  }
  for (lVar66 = 0x14; uVar67 = uVar64, uVar64 = uVar69, lVar66 != 0x28; lVar66 = lVar66 + 1) {
    uVar69 = (uint)lVar66;
    uVar71 = uVar69 & 0xf;
    uVar69 = paVar1->b32[uVar71 ^ 8] ^ paVar1->b32[uVar69 + 0xd & 0xf] ^
             paVar1->b32[uVar69 + 2 & 0xf] ^ paVar1->b32[uVar71];
    uVar68 = uVar69 << 1 | (uint)((int)uVar69 < 0);
    paVar1->b32[uVar71] = uVar68;
    uVar69 = uVar70 << 0x1e;
    uVar71 = uVar70 >> 2;
    iVar74 = (uVar64 ^ uVar67 ^ uVar70) + uVar73;
    uVar70 = uVar75;
    uVar69 = uVar69 | uVar71;
    uVar73 = uVar67;
    uVar75 = uVar68 + iVar74 + (uVar75 << 5 | uVar75 >> 0x1b) + 0x6ed9eba1;
  }
  for (lVar66 = 0x28; uVar69 = uVar67, uVar67 = uVar64, lVar66 != 0x3c; lVar66 = lVar66 + 1) {
    uVar71 = (uint)lVar66;
    uVar64 = uVar71 & 0xf;
    uVar71 = paVar1->b32[uVar64 ^ 8] ^ paVar1->b32[uVar71 + 0xd & 0xf] ^
             paVar1->b32[uVar71 + 2 & 0xf] ^ paVar1->b32[uVar64];
    uVar68 = uVar71 << 1 | (uint)((int)uVar71 < 0);
    paVar1->b32[uVar64] = uVar68;
    uVar71 = (uVar67 | uVar69) & uVar70;
    uVar23 = (ushort)lVar66;
    iVar74 = uVar73 + (uVar75 << 5 | uVar75 >> 0x1b);
    uVar73 = uVar70 << 0x1e;
    uVar64 = uVar70 >> 2;
    uVar70 = uVar75;
    uVar64 = uVar73 | uVar64;
    uVar73 = uVar69;
    uVar75 = iVar74 + (uVar67 & uVar69 | uVar71) + uVar68 + _K[(byte)((uVar23 & 0xff) / 0x14)];
  }
  for (lVar66 = 0x3c; uVar64 = uVar69, uVar69 = uVar67, lVar66 != 0x50; lVar66 = lVar66 + 1) {
    uVar67 = (uint)lVar66;
    uVar68 = uVar67 & 0xf;
    uVar67 = paVar1->b32[uVar68 ^ 8] ^ paVar1->b32[uVar67 + 0xd & 0xf] ^
             paVar1->b32[uVar67 + 2 & 0xf] ^ paVar1->b32[uVar68];
    uVar72 = uVar67 << 1 | (uint)((int)uVar67 < 0);
    uVar67 = uVar70 << 0x1e;
    uVar71 = uVar70 >> 2;
    iVar74 = (uVar69 ^ uVar64 ^ uVar70) + uVar73;
    paVar1->b32[uVar68] = uVar72;
    uVar23 = (ushort)lVar66;
    uVar70 = uVar75;
    uVar67 = uVar67 | uVar71;
    uVar73 = uVar64;
    uVar75 = iVar74 + (uVar75 << 5 | uVar75 >> 0x1b) + uVar72 + _K[(byte)((uVar23 & 0xff) / 0x14)];
  }
  (ctxt->h).b32[0] = uVar75 + uVar2;
  (ctxt->h).b32[1] = uVar70 + uVar3;
  (ctxt->h).b32[2] = uVar69 + uVar4;
  (ctxt->h).b32[3] = uVar64 + uVar5;
  (ctxt->h).b32[4] = uVar73 + uVar6;
  *(undefined1 (*) [16])((long)&ctxt->m + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&ctxt->m + 0x20) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&ctxt->m + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])paVar1 = (undefined1  [16])0x0;
  return;
}

Assistant:

static void
sha1_step(struct sha1_ctxt *ctxt)
{
	unsigned int	a, b, c, d, e, tmp;
	size_t t, s;

#if BYTE_ORDER == LITTLE_ENDIAN
	struct sha1_ctxt tctxt;

	memcpy(&tctxt.m.b8[0], &ctxt->m.b8[0], 64);
	ctxt->m.b8[0] = tctxt.m.b8[3]; ctxt->m.b8[1] = tctxt.m.b8[2];
	ctxt->m.b8[2] = tctxt.m.b8[1]; ctxt->m.b8[3] = tctxt.m.b8[0];
	ctxt->m.b8[4] = tctxt.m.b8[7]; ctxt->m.b8[5] = tctxt.m.b8[6];
	ctxt->m.b8[6] = tctxt.m.b8[5]; ctxt->m.b8[7] = tctxt.m.b8[4];
	ctxt->m.b8[8] = tctxt.m.b8[11]; ctxt->m.b8[9] = tctxt.m.b8[10];
	ctxt->m.b8[10] = tctxt.m.b8[9]; ctxt->m.b8[11] = tctxt.m.b8[8];
	ctxt->m.b8[12] = tctxt.m.b8[15]; ctxt->m.b8[13] = tctxt.m.b8[14];
	ctxt->m.b8[14] = tctxt.m.b8[13]; ctxt->m.b8[15] = tctxt.m.b8[12];
	ctxt->m.b8[16] = tctxt.m.b8[19]; ctxt->m.b8[17] = tctxt.m.b8[18];
	ctxt->m.b8[18] = tctxt.m.b8[17]; ctxt->m.b8[19] = tctxt.m.b8[16];
	ctxt->m.b8[20] = tctxt.m.b8[23]; ctxt->m.b8[21] = tctxt.m.b8[22];
	ctxt->m.b8[22] = tctxt.m.b8[21]; ctxt->m.b8[23] = tctxt.m.b8[20];
	ctxt->m.b8[24] = tctxt.m.b8[27]; ctxt->m.b8[25] = tctxt.m.b8[26];
	ctxt->m.b8[26] = tctxt.m.b8[25]; ctxt->m.b8[27] = tctxt.m.b8[24];
	ctxt->m.b8[28] = tctxt.m.b8[31]; ctxt->m.b8[29] = tctxt.m.b8[30];
	ctxt->m.b8[30] = tctxt.m.b8[29]; ctxt->m.b8[31] = tctxt.m.b8[28];
	ctxt->m.b8[32] = tctxt.m.b8[35]; ctxt->m.b8[33] = tctxt.m.b8[34];
	ctxt->m.b8[34] = tctxt.m.b8[33]; ctxt->m.b8[35] = tctxt.m.b8[32];
	ctxt->m.b8[36] = tctxt.m.b8[39]; ctxt->m.b8[37] = tctxt.m.b8[38];
	ctxt->m.b8[38] = tctxt.m.b8[37]; ctxt->m.b8[39] = tctxt.m.b8[36];
	ctxt->m.b8[40] = tctxt.m.b8[43]; ctxt->m.b8[41] = tctxt.m.b8[42];
	ctxt->m.b8[42] = tctxt.m.b8[41]; ctxt->m.b8[43] = tctxt.m.b8[40];
	ctxt->m.b8[44] = tctxt.m.b8[47]; ctxt->m.b8[45] = tctxt.m.b8[46];
	ctxt->m.b8[46] = tctxt.m.b8[45]; ctxt->m.b8[47] = tctxt.m.b8[44];
	ctxt->m.b8[48] = tctxt.m.b8[51]; ctxt->m.b8[49] = tctxt.m.b8[50];
	ctxt->m.b8[50] = tctxt.m.b8[49]; ctxt->m.b8[51] = tctxt.m.b8[48];
	ctxt->m.b8[52] = tctxt.m.b8[55]; ctxt->m.b8[53] = tctxt.m.b8[54];
	ctxt->m.b8[54] = tctxt.m.b8[53]; ctxt->m.b8[55] = tctxt.m.b8[52];
	ctxt->m.b8[56] = tctxt.m.b8[59]; ctxt->m.b8[57] = tctxt.m.b8[58];
	ctxt->m.b8[58] = tctxt.m.b8[57]; ctxt->m.b8[59] = tctxt.m.b8[56];
	ctxt->m.b8[60] = tctxt.m.b8[63]; ctxt->m.b8[61] = tctxt.m.b8[62];
	ctxt->m.b8[62] = tctxt.m.b8[61]; ctxt->m.b8[63] = tctxt.m.b8[60];
#endif

	a = H(0); b = H(1); c = H(2); d = H(3); e = H(4);

	for (t = 0; t < 20; t++) {
		s = t & 0x0f;
		if (t >= 16)
			W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));

		tmp = S(5, a) + F0(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 20; t < 40; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F1(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 40; t < 60; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F2(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}
	for (t = 60; t < 80; t++) {
		s = t & 0x0f;
		W(s) = S(1, W((s+13) & 0x0f) ^ W((s+8) & 0x0f) ^
							W((s+2) & 0x0f) ^ W(s));
		tmp = S(5, a) + F3(b, c, d) + e + W(s) + K(t);
		e = d; d = c; c = S(30, b); b = a; a = tmp;
	}

	H(0) = H(0) + a;
	H(1) = H(1) + b;
	H(2) = H(2) + c;
	H(3) = H(3) + d;
	H(4) = H(4) + e;

	memset(&ctxt->m.b8[0], 0, 64);
}